

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_New_GlyphSlot(FT_Face face,FT_GlyphSlot *aslot)

{
  FT_Memory pFVar1;
  size_t __n;
  FT_Error FVar2;
  FT_GlyphSlot slot;
  FT_Slot_Internal pFVar3;
  FT_GlyphLoader pFVar4;
  FT_Driver_Class pFVar5;
  FT_Memory pFVar6;
  FT_Driver pFVar7;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  pFVar7 = face->driver;
  if (pFVar7 == (FT_Driver)0x0) {
    return 6;
  }
  pFVar1 = (pFVar7->root).memory;
  pFVar5 = pFVar7->clazz;
  __n = pFVar5->slot_object_size;
  if ((long)__n < 1) {
    FVar2 = 6;
    if (__n != 0) goto LAB_0013302a;
    slot = (FT_GlyphSlot)0x0;
    pFVar6 = pFVar1;
  }
  else {
    slot = (FT_GlyphSlot)(*pFVar1->alloc)(pFVar1,__n);
    if (slot == (FT_GlyphSlot)0x0) {
      FVar2 = 0x40;
LAB_0013302a:
      if (aslot != (FT_GlyphSlot *)0x0) {
        *aslot = (FT_GlyphSlot)0x0;
        return FVar2;
      }
      return FVar2;
    }
    memset(slot,0,__n);
    pFVar7 = face->driver;
    pFVar5 = pFVar7->clazz;
    pFVar6 = (pFVar7->root).memory;
  }
  slot->face = face;
  slot->library = (pFVar7->root).library;
  pFVar3 = (FT_Slot_Internal)(*pFVar6->alloc)(pFVar6,0x48);
  FVar2 = 0x40;
  if (pFVar3 != (FT_Slot_Internal)0x0) {
    (pFVar3->glyph_delta).x = 0;
    (pFVar3->glyph_delta).y = 0;
    (pFVar3->glyph_matrix).yx = 0;
    (pFVar3->glyph_matrix).yy = 0;
    (pFVar3->glyph_matrix).xx = 0;
    (pFVar3->glyph_matrix).xy = 0;
    pFVar3->loader = (FT_GlyphLoader)0x0;
    pFVar3->flags = 0;
    pFVar3->glyph_transformed = '\0';
    *(undefined3 *)&pFVar3->field_0xd = 0;
    pFVar3->glyph_hints = (void *)0x0;
    slot->internal = pFVar3;
    if ((((pFVar7->root).clazz)->module_flags & 0x200) == 0) {
      pFVar4 = (FT_GlyphLoader)(*pFVar6->alloc)(pFVar6,0xb0);
      if (pFVar4 == (FT_GlyphLoader)0x0) goto LAB_0013300c;
      memset(&pFVar4->max_points,0,0xa8);
      pFVar4->memory = pFVar6;
      pFVar3->loader = pFVar4;
    }
    if ((pFVar5->init_slot == (FT_Slot_InitFunc)0x0) ||
       (FVar2 = (*pFVar5->init_slot)(slot), FVar2 == 0)) {
      slot->next = face->glyph;
      face->glyph = slot;
      if (aslot == (FT_GlyphSlot *)0x0) {
        return 0;
      }
      *aslot = slot;
      return 0;
    }
  }
LAB_0013300c:
  ft_glyphslot_done(slot);
  (*pFVar1->free)(pFVar1,slot);
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_New_GlyphSlot( FT_Face        face,
                    FT_GlyphSlot  *aslot )
  {
    FT_Error         error;
    FT_Driver        driver;
    FT_Driver_Class  clazz;
    FT_Memory        memory;
    FT_GlyphSlot     slot = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !face->driver )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;
    clazz  = driver->clazz;
    memory = driver->root.memory;

    FT_TRACE4(( "FT_New_GlyphSlot: Creating new slot object\n" ));
    if ( !FT_ALLOC( slot, clazz->slot_object_size ) )
    {
      slot->face = face;

      error = ft_glyphslot_init( slot );
      if ( error )
      {
        ft_glyphslot_done( slot );
        FT_FREE( slot );
        goto Exit;
      }

      slot->next  = face->glyph;
      face->glyph = slot;

      if ( aslot )
        *aslot = slot;
    }
    else if ( aslot )
      *aslot = NULL;


  Exit:
    FT_TRACE4(( "FT_New_GlyphSlot: Return 0x%x\n", error ));

    return error;
  }